

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tests.cpp
# Opt level: O0

void merkle_tests::MerkleComputation
               (vector<uint256,_std::allocator<uint256>_> *leaves,uint256 *proot,bool *pmutated,
               uint32_t branchpos,vector<uint256,_std::allocator<uint256>_> *pbranch)

{
  pointer *ppuVar1;
  bool bVar2;
  size_type sVar3;
  base_blob<256U> *b;
  base_blob<256U> *pbVar4;
  const_reference pvVar5;
  uint in_ECX;
  long lVar6;
  char *in_RDX;
  undefined8 *in_RSI;
  uint256 *in_R8;
  long in_FS_OFFSET;
  bool bVar7;
  bool bVar8;
  bool matchh;
  int level;
  int level_1;
  bool matchh_1;
  int matchlevel;
  uint32_t count;
  bool mutated;
  uint256 h;
  uint256 h_1;
  uint256 inner [32];
  uint256 *in_stack_fffffffffffffac8;
  pointer *local_518;
  int local_508;
  int local_504;
  int local_4fc;
  uint local_4f8;
  undefined4 in_stack_fffffffffffffb18;
  pointer local_4c8;
  pointer local_4c0;
  pointer local_4b8;
  pointer local_4b0;
  pointer local_4a8;
  pointer local_4a0;
  pointer local_498;
  pointer local_490;
  pointer local_488;
  pointer local_480;
  pointer local_478;
  pointer local_470;
  pointer local_468;
  pointer local_460;
  pointer local_458;
  pointer local_450;
  pointer local_448;
  pointer local_440;
  pointer local_438;
  pointer local_430;
  pointer local_428 [128];
  pointer local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_R8 != (uint256 *)0x0) {
    std::vector<uint256,_std::allocator<uint256>_>::clear
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffac8);
  }
  sVar3 = std::vector<uint256,_std::allocator<uint256>_>::size
                    ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffac8);
  if (sVar3 == 0) {
    if (in_RDX != (char *)0x0) {
      *in_RDX = '\0';
    }
    if (in_RSI != (undefined8 *)0x0) {
      memset(&local_28,0,0x20);
      uint256::uint256(in_stack_fffffffffffffac8);
      *in_RSI = local_28;
      in_RSI[1] = local_20;
      in_RSI[2] = local_18;
      in_RSI[3] = local_10;
    }
  }
  else {
    bVar8 = false;
    local_4f8 = 0;
    ppuVar1 = local_428;
    do {
      local_518 = ppuVar1;
      uint256::uint256(in_stack_fffffffffffffac8);
      ppuVar1 = local_518 + 4;
    } while (local_518 + 4 != &local_28);
    local_4fc = -1;
    while( true ) {
      b = (base_blob<256U> *)(ulong)local_4f8;
      pbVar4 = (base_blob<256U> *)
               std::vector<uint256,_std::allocator<uint256>_>::size
                         ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffac8);
      if (pbVar4 <= b) break;
      pvVar5 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                         ((vector<uint256,_std::allocator<uint256>_> *)local_518,(size_type)b);
      local_448 = *(pointer *)(pvVar5->super_base_blob<256U>).m_data._M_elems;
      local_440 = *(pointer *)((pvVar5->super_base_blob<256U>).m_data._M_elems + 8);
      local_438 = *(pointer *)((pvVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_430 = *(pointer *)((pvVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
      bVar7 = local_4f8 == in_ECX;
      local_4f8 = local_4f8 + 1;
      local_504 = 0;
      while ((local_4f8 & 1 << ((byte)local_504 & 0x1f)) == 0) {
        if (in_R8 != (uint256 *)0x0) {
          if (bVar7) {
            std::vector<uint256,_std::allocator<uint256>_>::push_back
                      ((vector<uint256,_std::allocator<uint256>_> *)local_518,(value_type *)b);
          }
          else if (local_4fc == local_504) {
            std::vector<uint256,_std::allocator<uint256>_>::push_back
                      ((vector<uint256,_std::allocator<uint256>_> *)local_518,(value_type *)b);
            bVar7 = true;
          }
        }
        bVar2 = ::operator==((base_blob<256U> *)local_518,b);
        bVar8 = bVar8 != false || bVar2;
        Hash<uint256,uint256>((uint256 *)CONCAT44(in_ECX,in_stack_fffffffffffffb18),in_R8);
        local_448 = local_468;
        local_440 = local_460;
        local_438 = local_458;
        local_430 = local_450;
        local_504 = local_504 + 1;
      }
      lVar6 = (long)local_504;
      local_428[lVar6 * 4] = local_448;
      local_428[lVar6 * 4 + 1] = local_440;
      local_428[lVar6 * 4 + 2] = local_438;
      local_428[lVar6 * 4 + 3] = local_430;
      if (bVar7) {
        local_4fc = local_504;
      }
    }
    local_508 = 0;
    while ((local_4f8 & 1 << ((byte)local_508 & 0x1f)) == 0) {
      local_508 = local_508 + 1;
    }
    lVar6 = (long)local_508;
    local_488 = local_428[lVar6 * 4];
    local_480 = local_428[lVar6 * 4 + 1];
    local_478 = local_428[lVar6 * 4 + 2];
    local_470 = local_428[lVar6 * 4 + 3];
    bVar7 = local_4fc == local_508;
    while (local_4f8 != 1 << ((byte)local_508 & 0x1f)) {
      if ((in_R8 != (uint256 *)0x0) && (bVar7)) {
        std::vector<uint256,_std::allocator<uint256>_>::push_back
                  ((vector<uint256,_std::allocator<uint256>_> *)local_518,(value_type *)b);
      }
      Hash<uint256,uint256>((uint256 *)CONCAT44(in_ECX,in_stack_fffffffffffffb18),in_R8);
      local_488 = local_4a8;
      local_480 = local_4a0;
      local_478 = local_498;
      local_470 = local_490;
      local_4f8 = (1 << ((byte)local_508 & 0x1f)) + local_4f8;
      while (local_508 = local_508 + 1, (local_4f8 & 1 << ((byte)local_508 & 0x1f)) == 0) {
        if (in_R8 != (uint256 *)0x0) {
          if (bVar7) {
            std::vector<uint256,_std::allocator<uint256>_>::push_back
                      ((vector<uint256,_std::allocator<uint256>_> *)local_518,(value_type *)b);
          }
          else if (local_4fc == local_508) {
            std::vector<uint256,_std::allocator<uint256>_>::push_back
                      ((vector<uint256,_std::allocator<uint256>_> *)local_518,(value_type *)b);
            bVar7 = true;
          }
        }
        Hash<uint256,uint256>((uint256 *)CONCAT44(in_ECX,in_stack_fffffffffffffb18),in_R8);
        local_488 = local_4c8;
        local_480 = local_4c0;
        local_478 = local_4b8;
        local_470 = local_4b0;
      }
    }
    if (in_RDX != (char *)0x0) {
      *in_RDX = bVar8;
    }
    if (in_RSI != (undefined8 *)0x0) {
      *in_RSI = local_488;
      in_RSI[1] = local_480;
      in_RSI[2] = local_478;
      in_RSI[3] = local_470;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void MerkleComputation(const std::vector<uint256>& leaves, uint256* proot, bool* pmutated, uint32_t branchpos, std::vector<uint256>* pbranch) {
    if (pbranch) pbranch->clear();
    if (leaves.size() == 0) {
        if (pmutated) *pmutated = false;
        if (proot) *proot = uint256();
        return;
    }
    bool mutated = false;
    // count is the number of leaves processed so far.
    uint32_t count = 0;
    // inner is an array of eagerly computed subtree hashes, indexed by tree
    // level (0 being the leaves).
    // For example, when count is 25 (11001 in binary), inner[4] is the hash of
    // the first 16 leaves, inner[3] of the next 8 leaves, and inner[0] equal to
    // the last leaf. The other inner entries are undefined.
    uint256 inner[32];
    // Which position in inner is a hash that depends on the matching leaf.
    int matchlevel = -1;
    // First process all leaves into 'inner' values.
    while (count < leaves.size()) {
        uint256 h = leaves[count];
        bool matchh = count == branchpos;
        count++;
        int level;
        // For each of the lower bits in count that are 0, do 1 step. Each
        // corresponds to an inner value that existed before processing the
        // current leaf, and each needs a hash to combine it.
        for (level = 0; !(count & ((uint32_t{1}) << level)); level++) {
            if (pbranch) {
                if (matchh) {
                    pbranch->push_back(inner[level]);
                } else if (matchlevel == level) {
                    pbranch->push_back(h);
                    matchh = true;
                }
            }
            mutated |= (inner[level] == h);
            h = Hash(inner[level], h);
        }
        // Store the resulting hash at inner position level.
        inner[level] = h;
        if (matchh) {
            matchlevel = level;
        }
    }
    // Do a final 'sweep' over the rightmost branch of the tree to process
    // odd levels, and reduce everything to a single top value.
    // Level is the level (counted from the bottom) up to which we've sweeped.
    int level = 0;
    // As long as bit number level in count is zero, skip it. It means there
    // is nothing left at this level.
    while (!(count & ((uint32_t{1}) << level))) {
        level++;
    }
    uint256 h = inner[level];
    bool matchh = matchlevel == level;
    while (count != ((uint32_t{1}) << level)) {
        // If we reach this point, h is an inner value that is not the top.
        // We combine it with itself (Bitcoin's special rule for odd levels in
        // the tree) to produce a higher level one.
        if (pbranch && matchh) {
            pbranch->push_back(h);
        }
        h = Hash(h, h);
        // Increment count to the value it would have if two entries at this
        // level had existed.
        count += ((uint32_t{1}) << level);
        level++;
        // And propagate the result upwards accordingly.
        while (!(count & ((uint32_t{1}) << level))) {
            if (pbranch) {
                if (matchh) {
                    pbranch->push_back(inner[level]);
                } else if (matchlevel == level) {
                    pbranch->push_back(h);
                    matchh = true;
                }
            }
            h = Hash(inner[level], h);
            level++;
        }
    }
    // Return result.
    if (pmutated) *pmutated = mutated;
    if (proot) *proot = h;
}